

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

DWARFCompileUnit * __thiscall
llvm::DWARFContext::getDWOCompileUnitForHash(DWARFContext *this,uint64_t Hash)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  DWARFUnitIndex *this_00;
  Entry *E;
  DWARFUnit *pDVar4;
  long lVar5;
  DWARFUnit *pDVar6;
  Optional<unsigned_long> OVar7;
  DWARFFormValue local_80;
  char local_50;
  DWARFDie local_48;
  unsigned_long local_38;
  
  parseDWOUnits(this,true);
  this_00 = getCUIndex(this);
  if ((this_00->Header).NumBuckets == 0) {
    pDVar6 = (DWARFUnit *)0x0;
    parseDWOUnits(this,false);
    uVar1 = (this->DWOUnits).NumInfoUnits;
    if (uVar1 == 0xffffffff) {
      uVar1 = (this->DWOUnits).
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              .
              super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              .
              super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
              .
              super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
              .super_SmallVectorBase.Size;
    }
    if (uVar1 != 0) {
      pvVar2 = (this->DWOUnits).
               super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
               .
               super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
               .
               super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
               .
               super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
               .super_SmallVectorBase.BeginX;
      pDVar6 = (DWARFUnit *)0x0;
      lVar5 = 0;
      local_38 = Hash;
      do {
        pDVar4 = *(DWARFUnit **)((long)pvVar2 + lVar5);
        DWARFUnit::extractDIEsIfNeeded(pDVar4,true);
        if (((pDVar4->Header).DWOId.Storage.hasVal & 1U) == 0) {
          pDVar4 = *(DWARFUnit **)((long)pvVar2 + lVar5);
          DWARFUnit::extractDIEsIfNeeded(pDVar4,true);
          local_48.Die = (pDVar4->DieArray).
                         super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          local_48.U = pDVar4;
          if ((DWARFUnit *)local_48.Die ==
              (DWARFUnit *)
              (pDVar4->DieArray).
              super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_48.Die = (DWARFDebugInfoEntry *)(DWARFUnit *)0x0;
            local_48.U = (DWARFUnit *)0x0;
          }
          DWARFDie::find((Optional<llvm::DWARFFormValue> *)&local_80,&local_48,DW_AT_GNU_dwo_id);
          if (local_50 != '\0') {
            OVar7 = DWARFFormValue::getAsUnsignedConstant(&local_80);
            if (((undefined1  [16])OVar7.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0)
            {
              lVar3 = *(long *)((long)pvVar2 + lVar5);
              if (*(char *)(lVar3 + 0x58) == '\x01') {
                if (*(unsigned_long *)(lVar3 + 0x50) != OVar7.Storage.field_0.value) {
                  __assert_fail("(!DWOId || *DWOId == Id) && \"setting DWOId to a different value\""
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFUnit.h"
                                ,0x59,"void llvm::DWARFUnitHeader::setDWOId(uint64_t)");
                }
              }
              else {
                *(undefined1 *)(lVar3 + 0x58) = 1;
              }
              ((anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 *)(lVar3 + 0x50))
              ->value = (unsigned_long)OVar7.Storage.field_0;
              goto LAB_00ae0d67;
            }
          }
        }
        else {
LAB_00ae0d67:
          pDVar4 = *(DWARFUnit **)((long)pvVar2 + lVar5);
          DWARFUnit::extractDIEsIfNeeded(pDVar4,true);
          if ((((pDVar4->Header).DWOId.Storage.hasVal & 1U) != 0) &&
             ((pDVar4->Header).DWOId.Storage.field_0.value == local_38)) {
            pDVar4 = *(DWARFUnit **)((long)pvVar2 + lVar5);
            if (pDVar4 == (DWARFUnit *)0x0) {
              __assert_fail("Val && \"isa<> used on a null pointer\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                            ,0x69,
                            "static bool llvm::isa_impl_cl<llvm::DWARFCompileUnit, const llvm::DWARFUnit *>::doit(const From *) [To = llvm::DWARFCompileUnit, From = const llvm::DWARFUnit *]"
                           );
            }
            goto LAB_00ae0e1c;
          }
        }
        lVar5 = lVar5 + 8;
      } while ((ulong)uVar1 * 8 != lVar5);
    }
  }
  else {
    E = DWARFUnitIndex::getFromHash(this_00,Hash);
    if ((E == (Entry *)0x0) ||
       (pDVar4 = DWARFUnitVector::getUnitForIndexEntry(&this->DWOUnits,E),
       pDVar4 == (DWARFUnit *)0x0)) {
      pDVar6 = (DWARFUnit *)0x0;
    }
    else {
LAB_00ae0e1c:
      pDVar6 = (DWARFUnit *)0x0;
      if (((pDVar4->Header).UnitType & 0xfb) != 2) {
        pDVar6 = pDVar4;
      }
    }
  }
  return (DWARFCompileUnit *)pDVar6;
}

Assistant:

DWARFCompileUnit *DWARFContext::getDWOCompileUnitForHash(uint64_t Hash) {
  parseDWOUnits(LazyParse);

  if (const auto &CUI = getCUIndex()) {
    if (const auto *R = CUI.getFromHash(Hash))
      return dyn_cast_or_null<DWARFCompileUnit>(
          DWOUnits.getUnitForIndexEntry(*R));
    return nullptr;
  }

  // If there's no index, just search through the CUs in the DWO - there's
  // probably only one unless this is something like LTO - though an in-process
  // built/cached lookup table could be used in that case to improve repeated
  // lookups of different CUs in the DWO.
  for (const auto &DWOCU : dwo_compile_units()) {
    // Might not have parsed DWO ID yet.
    if (!DWOCU->getDWOId()) {
      if (Optional<uint64_t> DWOId =
          toUnsigned(DWOCU->getUnitDIE().find(DW_AT_GNU_dwo_id)))
        DWOCU->setDWOId(*DWOId);
      else
        // No DWO ID?
        continue;
    }
    if (DWOCU->getDWOId() == Hash)
      return dyn_cast<DWARFCompileUnit>(DWOCU.get());
  }
  return nullptr;
}